

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O1

void xmlXPtrEvalChildSeq(xmlXPathParserContextPtr ctxt,xmlChar *name)

{
  xmlChar xVar1;
  byte bVar2;
  xmlChar *pxVar3;
  xmlNodeSetPtr pxVar4;
  bool bVar5;
  bool bVar6;
  xmlXPathObjectPtr pxVar7;
  byte *pbVar8;
  xmlNodePtr pxVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  
  if (name == (xmlChar *)0x0) {
    if ((*ctxt->cur == '/') && (ctxt->cur[1] != '1')) {
      xmlXPtrErr(ctxt,0x76d,"warning: ChildSeq not starting by /1\n",(xmlChar *)0x0);
    }
  }
  else {
    pxVar7 = xmlXPathNewString(name);
    valuePush(ctxt,pxVar7);
    (*xmlFree)(name);
    xmlXPathIdFunction(ctxt,1);
    if (ctxt->error != 0) {
      return;
    }
  }
  pxVar3 = ctxt->cur;
  xVar1 = *pxVar3;
  do {
    if (xVar1 != '/') {
      return;
    }
    ctxt->cur = pxVar3 + 1;
    bVar2 = pxVar3[1];
    iVar12 = 0;
    if ((byte)(bVar2 - 0x30) < 10) {
      pbVar8 = pxVar3 + 2;
      iVar12 = 0;
      bVar5 = false;
      do {
        iVar10 = iVar12 * 10;
        if (0xccccccc < iVar12) {
          iVar10 = iVar12;
        }
        iVar11 = -0x7fffffd1 - (uint)bVar2;
        bVar6 = true;
        if (iVar10 <= iVar11) {
          bVar6 = bVar5;
        }
        bVar5 = bVar6;
        if (0xccccccc < iVar12) {
          bVar5 = true;
        }
        iVar12 = 0;
        if (iVar10 <= iVar11) {
          iVar12 = bVar2 - 0x30;
        }
        iVar12 = iVar12 + iVar10;
        ctxt->cur = pbVar8;
        bVar2 = *pbVar8;
        pbVar8 = pbVar8 + 1;
      } while ((byte)(bVar2 - 0x30) < 10);
      if (bVar5) {
        iVar12 = 0;
      }
    }
    if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type != XPATH_NODESET)) {
      xmlXPathErr(ctxt,0xb);
    }
    else {
      pxVar7 = valuePop(ctxt);
      pxVar4 = pxVar7->nodesetval;
      if ((pxVar4 == (xmlNodeSetPtr)0x0 || iVar12 < 1) || (pxVar4->nodeNr != 1)) {
LAB_001e76b9:
        xmlXPathFreeObject(pxVar7);
        pxVar7 = xmlXPathNewNodeSet((xmlNodePtr)0x0);
      }
      else {
        pxVar9 = *pxVar4->nodeTab;
        if ((pxVar9 != (xmlNodePtr)0x0) && (pxVar9->type != XML_NAMESPACE_DECL)) {
          pxVar9 = pxVar9->children;
          iVar10 = 0;
          while (pxVar9 != (xmlNodePtr)0x0) {
            if ((((pxVar9->type < XML_DTD_NODE) &&
                 ((0x2202U >> (pxVar9->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) &&
                (iVar10 = iVar10 + 1, iVar10 == iVar12)) || (pxVar9 = pxVar9->next, iVar12 < iVar10)
               ) goto LAB_001e76af;
          }
          pxVar9 = (xmlNodePtr)0x0;
        }
LAB_001e76af:
        if (pxVar9 == (xmlNodePtr)0x0) goto LAB_001e76b9;
        *pxVar4->nodeTab = pxVar9;
      }
      valuePush(ctxt,pxVar7);
    }
    pxVar3 = ctxt->cur;
    xVar1 = *pxVar3;
  } while( true );
}

Assistant:

static void
xmlXPtrEvalChildSeq(xmlXPathParserContextPtr ctxt, xmlChar *name) {
    /*
     * XPointer don't allow by syntax to address in multirooted trees
     * this might prove useful in some cases, warn about it.
     */
    if ((name == NULL) && (CUR == '/') && (NXT(1) != '1')) {
        xmlXPtrErr(ctxt, XML_XPTR_CHILDSEQ_START,
		   "warning: ChildSeq not starting by /1\n", NULL);
    }

    if (name != NULL) {
	valuePush(ctxt, xmlXPathNewString(name));
	xmlFree(name);
	xmlXPathIdFunction(ctxt, 1);
	CHECK_ERROR;
    }

    while (CUR == '/') {
	int child = 0, overflow = 0;
	NEXT;

	while ((CUR >= '0') && (CUR <= '9')) {
            int d = CUR - '0';
            if (child > INT_MAX / 10)
                overflow = 1;
            else
                child *= 10;
            if (child > INT_MAX - d)
                overflow = 1;
            else
                child += d;
	    NEXT;
	}
        if (overflow)
            child = 0;
	xmlXPtrGetChildNo(ctxt, child);
    }
}